

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

Am_Object Am_Find_Part_Place(Am_Object *obj,Am_Object *group)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *in_RDX;
  Am_Object local_48;
  Am_Object part;
  undefined1 local_30 [8];
  Am_Value_List group_parts;
  Am_Object *group_local;
  Am_Object *obj_local;
  
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30);
  pAVar2 = Am_Object::Get(in_RDX,0x82,0);
  Am_Value_List::operator=((Am_Value_List *)local_30,pAVar2);
  Am_Object::Am_Object(&local_48);
  Am_Value_List::Start((Am_Value_List *)local_30);
  do {
    bVar1 = Am_Value_List::Last((Am_Value_List *)local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Am_Object::Am_Object(obj,&Am_No_Object);
LAB_00315008:
      Am_Object::~Am_Object(&local_48);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
      return (Am_Object)(Am_Object_Data *)obj;
    }
    pAVar2 = Am_Value_List::Get((Am_Value_List *)local_30);
    Am_Object::operator=(&local_48,pAVar2);
    bVar1 = Am_Object::operator==(&local_48,group);
    if (bVar1) {
      Am_Value_List::Next((Am_Value_List *)local_30);
      bVar1 = Am_Value_List::Last((Am_Value_List *)local_30);
      if (bVar1) {
        Am_Object::Am_Object(obj,&Am_No_Object);
      }
      else {
        pAVar2 = Am_Value_List::Get((Am_Value_List *)local_30);
        Am_Object::operator=(&local_48,pAVar2);
        Am_Object::Am_Object(obj,&local_48);
      }
      goto LAB_00315008;
    }
    Am_Value_List::Next((Am_Value_List *)local_30);
  } while( true );
}

Assistant:

Am_Object
Am_Find_Part_Place(Am_Object obj, Am_Object group)
{
  Am_Value_List group_parts;
  group_parts = group.Get(Am_GRAPHICAL_PARTS);
  Am_Object part;
  for (group_parts.Start(); !group_parts.Last(); group_parts.Next()) {
    part = group_parts.Get();
    if (part == obj) {
      group_parts.Next();
      if (group_parts.Last())
        return Am_No_Object;
      else {
        part = group_parts.Get();
        return part;
      }
    }
  }
  return Am_No_Object;
}